

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O1

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,AttributeInfo *attributeInfo)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  string formatName;
  ostringstream caseName;
  undefined1 auStack_1f8 [8];
  string local_1f0;
  string local_1d0;
  long *local_1b0 [2];
  long local_1a0 [2];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  pcVar1 = ::vk::getFormatName(*(VkFormat *)(this + 4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,pcVar1,(allocator<char> *)&local_1f0);
  pcVar1 = *(char **)(VertexInputTest::s_glslTypeDescriptions + (ulong)*(uint *)this * 0x18);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x68);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_as_",4);
  std::__cxx11::string::substr((ulong)&local_1d0,(ulong)local_1b0);
  de::toLower(&local_1f0,&local_1d0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_rate_",6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = "instance";
  if (*(int *)(this + 8) == 0) {
    pcVar1 = "vertex";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,pcVar1,(ulong)(*(int *)(this + 8) != 0) * 2 + 6);
  std::__cxx11::stringbuf::str();
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string getAttributeInfoCaseName (const VertexInputTest::AttributeInfo& attributeInfo)
{
	std::ostringstream	caseName;
	const std::string	formatName	= getFormatName(attributeInfo.vkType);

	caseName << VertexInputTest::s_glslTypeDescriptions[attributeInfo.glslType].name << "_as_" << de::toLower(formatName.substr(10)) << "_rate_";

	if (attributeInfo.inputRate == VK_VERTEX_INPUT_RATE_VERTEX)
		caseName <<  "vertex";
	else
		caseName <<  "instance";

	return caseName.str();
}